

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

char * mctools_fileextension_view(mcu8str *path)

{
  char *itLastDot;
  char *it;
  char *local_20;
  char *local_18;
  mcu8str *in_stack_fffffffffffffff8;
  
  local_18 = mctools_basename_view(in_stack_fffffffffffffff8);
  local_20 = (char *)0x0;
  for (; *local_18 != '\0'; local_18 = local_18 + 1) {
    if (*local_18 == '.') {
      local_20 = local_18;
    }
  }
  if (local_20 != (char *)0x0) {
    local_18 = local_20 + 1;
  }
  return local_18;
}

Assistant:

const char* mctools_fileextension_view( const mcu8str* path )
  {
    const char * it = mctools_basename_view( path );
    const char * itLastDot = NULL;
    while ( 1 ) {
      if ( *it == 0 )
        break;//end of string reached
      if ( *it == '.' )
        itLastDot = it;
      ++it;
    }
    if ( itLastDot )
      return itLastDot + 1;
    return it;//empty string
  }